

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,_QMimeTypeXMLData>::emplace_helper<QMimeTypeXMLData>
          (QHash<QString,_QMimeTypeXMLData> *this,QString *key,QMimeTypeXMLData *args)

{
  byte bVar1;
  piter pVar2;
  Node<QString,_QMimeTypeXMLData> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::findOrInsert<QString>
            ((InsertionResult *)local_38,this->d,key);
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  n = (Node<QString,_QMimeTypeXMLData> *)
      ((((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries)->storage).data +
      (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QString,_QMimeTypeXMLData>::createInPlace<QMimeTypeXMLData>(n,key,args);
  }
  else {
    QHashPrivate::Node<QString,_QMimeTypeXMLData>::emplaceValue<QMimeTypeXMLData>(n,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }